

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::AssertionResult::getExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  bool bVar1;
  AssertionResult *this_local;
  
  bVar1 = isFalseTest((this->m_info).resultDisposition);
  if (bVar1) {
    std::operator+(__return_storage_ptr__,"!",&(this->m_info).capturedExpression);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(this->m_info).capturedExpression);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpression() const {
        if( isFalseTest( m_info.resultDisposition ) )
            return "!" + m_info.capturedExpression;
        else
            return m_info.capturedExpression;
    }